

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
          (cmTargetCollectLinkLanguages *this,cmGeneratorTarget *target,string *config,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,cmGeneratorTarget *head)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  cmGeneratorTarget *local_28;
  
  paVar1 = &(this->Config).field_2;
  (this->Config)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (config->_M_dataplus)._M_p;
  paVar2 = &config->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&config->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Config).field_2 + 8) = uVar5;
  }
  else {
    (this->Config)._M_dataplus._M_p = pcVar4;
    (this->Config).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Config)._M_string_length = config->_M_string_length;
  (config->_M_dataplus)._M_p = (pointer)paVar2;
  config->_M_string_length = 0;
  (config->field_2)._M_local_buf[0] = '\0';
  this->Languages = languages;
  this->HeadTarget = head;
  this->Target = target;
  p_Var3 = &(this->Visited)._M_t._M_impl.super__Rb_tree_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->Visited)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = target;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*const&>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)&this->Visited,&local_28);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmGeneratorTarget const* target,
                               std::string config,
                               std::unordered_set<std::string>& languages,
                               cmGeneratorTarget const* head)
    : Config(std::move(config))
    , Languages(languages)
    , HeadTarget(head)
    , Target(target)
  {
    this->Visited.insert(target);
  }